

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_poly_vector.h
# Opt level: O0

void __thiscall Cookie::~Cookie(Cookie *this)

{
  ostream *this_00;
  void *this_01;
  Cookie *this_local;
  
  if (this->cookie != 0xdeadbeef) {
    this_00 = std::operator<<((ostream *)&std::cerr,"cookie value was ");
    this_01 = (void *)std::ostream::operator<<(this_00,this->cookie);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  if (this->cookie == 0xdeadbeef) {
    this->cookie = 0;
    return;
  }
  __assert_fail("cookie == constructed_cookie",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fecjanky[P]poly_vector/test/include/test_poly_vector.h"
                ,0x35,"Cookie::~Cookie()");
}

Assistant:

~Cookie()
    {
        if (cookie != constructed_cookie) {
            std::cerr << "cookie value was " << cookie << std::endl;
        }
        assert(cookie == constructed_cookie);
        cookie = 0;
    }